

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O3

void Imf_3_2::(anonymous_namespace)::
     readStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
               (char **readPtr,char *endPtr,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *outputVector,int numberOfStrings)

{
  const_iterator __position;
  int iVar1;
  uint64_t uVar2;
  InputExc *pIVar3;
  long lVar4;
  char *pcVar5;
  size_type sVar6;
  size_type __n;
  char b [4];
  vector<unsigned_long,_std::allocator<unsigned_long>_> lengths;
  value_type local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  size_type local_38;
  
  if (endPtr < *readPtr + 4) {
    pIVar3 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::InputExc::InputExc(pIVar3,"IDManifest too small for string list size");
    __cxa_throw(pIVar3,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
  }
  lVar4 = 0;
  pcVar5 = *readPtr;
  do {
    *readPtr = pcVar5 + 1;
    *(char *)((long)&local_70._M_dataplus._M_p + lVar4) = *pcVar5;
    lVar4 = lVar4 + 1;
    pcVar5 = pcVar5 + 1;
  } while ((int)lVar4 != 4);
  iVar1 = (int)local_70._M_dataplus._M_p;
  __n = (size_type)(int)local_70._M_dataplus._M_p;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_50,__n,(allocator_type *)&local_70);
  if (iVar1 < 1) {
    if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      return;
    }
  }
  else {
    sVar6 = 0;
    do {
      uVar2 = anon_unknown_4::readVariableLengthInteger(readPtr,endPtr);
      local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[sVar6] = uVar2;
      sVar6 = sVar6 + 1;
    } while (__n != sVar6);
    if (0 < iVar1) {
      pcVar5 = *readPtr;
      sVar6 = 0;
      local_38 = __n;
      do {
        if (endPtr < pcVar5 + local_50.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[sVar6]) {
          pIVar3 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::InputExc::InputExc(pIVar3,"IDManifest too small for string");
          __cxa_throw(pIVar3,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
        }
        __position._M_current =
             (outputVector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_insert_rval(outputVector,__position,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        pcVar5 = *readPtr +
                 local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar6];
        *readPtr = pcVar5;
        sVar6 = sVar6 + 1;
      } while (local_38 != sVar6);
    }
  }
  operator_delete(local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (long)local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void
readStringList (
    const char*& readPtr,
    const char*  endPtr,
    T&           outputVector,
    int          numberOfStrings = 0)
{
    if (numberOfStrings == 0)
    {
        if (readPtr + 4 > endPtr)
        {
            throw IEX_NAMESPACE::InputExc (
                "IDManifest too small for string list size");
        }
        Xdr::read<CharPtrIO> (readPtr, numberOfStrings);
    }

    vector<size_t> lengths (numberOfStrings);

    for (int i = 0; i < numberOfStrings; ++i)
    {
        lengths[i] = readVariableLengthInteger (readPtr, endPtr);
    }
    for (int i = 0; i < numberOfStrings; ++i)
    {

        if (readPtr + lengths[i] > endPtr)
        {
            throw IEX_NAMESPACE::InputExc ("IDManifest too small for string");
        }
        outputVector.insert (outputVector.end (), string (readPtr, lengths[i]));
        readPtr += lengths[i];
    }
}